

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

void json_object_deinit(JSON_Object *object,parson_bool_t free_keys,parson_bool_t free_values)

{
  uint uVar1;
  ulong uVar2;
  
  if (object->count != 0) {
    uVar1 = 1;
    uVar2 = 0;
    do {
      if (free_keys != 0) {
        (*parson_free)(object->names[uVar2]);
      }
      if (free_values != 0) {
        json_value_free(object->values[uVar2]);
      }
      uVar2 = (ulong)uVar1;
      uVar1 = uVar1 + 1;
    } while (uVar2 < object->count);
  }
  object->count = 0;
  object->item_capacity = 0;
  object->cell_capacity = 0;
  (*parson_free)(object->cells);
  (*parson_free)(object->names);
  (*parson_free)(object->values);
  (*parson_free)(object->cell_ixs);
  (*parson_free)(object->hashes);
  object->cell_ixs = (size_t *)0x0;
  object->names = (char **)0x0;
  object->values = (JSON_Value **)0x0;
  object->cells = (size_t *)0x0;
  object->hashes = (unsigned_long *)0x0;
  return;
}

Assistant:

static void json_object_deinit(JSON_Object *object, parson_bool_t free_keys, parson_bool_t free_values) {
    unsigned int i = 0;
    for (i = 0; i < object->count; i++) {
        if (free_keys) {
            parson_free(object->names[i]);
        }
        if (free_values) {
            json_value_free(object->values[i]);
        }
    }

    object->count = 0;
    object->item_capacity = 0;
    object->cell_capacity = 0;

    parson_free(object->cells);
    parson_free(object->names);
    parson_free(object->values);
    parson_free(object->cell_ixs);
    parson_free(object->hashes);

    object->cells = NULL;
    object->names = NULL;
    object->values = NULL;
    object->cell_ixs = NULL;
    object->hashes = NULL;
}